

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O1

void __thiscall
minja::MacroNode::MacroNode
          (MacroNode *this,Location *loc,shared_ptr<minja::VariableExpr> *n,Parameters *p,
          shared_ptr<minja::TemplateNode> *b)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  element_type *peVar3;
  mapped_type *pmVar4;
  long lVar5;
  pointer ppVar6;
  mapped_type mVar7;
  
  (this->super_TemplateNode)._vptr_TemplateNode = (_func_int **)&PTR___cxa_pure_virtual_00268520;
  (this->super_TemplateNode).location_.source.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (loc->source).
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  p_Var1 = (loc->source).
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->super_TemplateNode).location_.source.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->super_TemplateNode).location_.pos = loc->pos;
  (this->super_TemplateNode)._vptr_TemplateNode = (_func_int **)&PTR_do_render_002688a8;
  (this->name).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (n->super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (n->super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (n->super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->name).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->name).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var1;
  (n->super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  ppVar6 = (p->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->params).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (p->
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->params).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppVar6;
  (this->params).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (p->
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (p->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (p->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (p->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->body).super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar3 = (b->super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (b->super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (b->super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->body).super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  (this->body).super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var1;
  (b->super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (this->named_param_positions)._M_h._M_buckets =
       &(this->named_param_positions)._M_h._M_single_bucket;
  (this->named_param_positions)._M_h._M_bucket_count = 1;
  (this->named_param_positions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->named_param_positions)._M_h._M_element_count = 0;
  (this->named_param_positions)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->named_param_positions)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->named_param_positions)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ppVar6 = (this->params).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->params).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar6) {
    lVar5 = 0;
    mVar7 = 0;
    do {
      if (*(long *)((long)&(ppVar6->first)._M_string_length + lVar5) != 0) {
        pmVar4 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&this->named_param_positions,
                              (key_type *)((long)&(ppVar6->first)._M_dataplus._M_p + lVar5));
        *pmVar4 = mVar7;
      }
      mVar7 = mVar7 + 1;
      ppVar6 = (this->params).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x30;
    } while (mVar7 < (ulong)(((long)(this->params).
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar6 >> 4)
                            * -0x5555555555555555));
  }
  return;
}

Assistant:

MacroNode(const Location & loc, std::shared_ptr<VariableExpr> && n, Expression::Parameters && p, std::shared_ptr<TemplateNode> && b)
        : TemplateNode(loc), name(std::move(n)), params(std::move(p)), body(std::move(b)) {
        for (size_t i = 0; i < params.size(); ++i) {
          const auto & name = params[i].first;
          if (!name.empty()) {
            named_param_positions[name] = i;
          }
        }
    }